

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cc
# Opt level: O2

void __thiscall
kratos::GeneratorPropertyVisitor::visit(GeneratorPropertyVisitor *this,Generator *generator)

{
  _Base_ptr p_Var1;
  __shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2> local_50 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  undefined1 local_40 [8];
  shared_ptr<kratos::AssertPropertyStmt> stmt;
  
  for (p_Var1 = (generator->properties_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(generator->properties_)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    std::make_shared<kratos::AssertPropertyStmt,std::shared_ptr<kratos::Property>const&>
              ((shared_ptr<kratos::Property> *)local_40);
    std::__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<kratos::AssertPropertyStmt,void>
              (local_50,(__shared_ptr<kratos::AssertPropertyStmt,_(__gnu_cxx::_Lock_policy)2> *)
                        local_40);
    Generator::add_stmt(generator,(shared_ptr<kratos::Stmt> *)local_50);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48);
    (*(((AssertBase *)local_40)->super_Stmt).super_IRNode._vptr_IRNode[7])(local_40,generator);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stmt);
  }
  return;
}

Assistant:

void visit(Generator* generator) override {
        auto const& properties = generator->properties();
        for (auto const& iter : properties) {
            auto stmt = std::make_shared<AssertPropertyStmt>(iter.second);
            generator->add_stmt(stmt);
            stmt->set_parent(generator);
        }
    }